

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionDAGChecker::ReportError
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorExpressionContext *context,string *expr)

{
  ostream *poVar1;
  cmake *pcVar2;
  string *psVar3;
  cmGeneratorExpressionDAGChecker *pcVar4;
  int iVar5;
  string local_1c8;
  ostringstream e;
  
  if ((this->CheckResult != DAG) && (context->HadError = true, context->Quiet == false)) {
    pcVar4 = this->Parent;
    if ((pcVar4 == (cmGeneratorExpressionDAGChecker *)0x0) ||
       (pcVar4->Parent != (cmGeneratorExpressionDAGChecker *)0x0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar1 = std::operator<<((ostream *)&e,"Error evaluating generator expression:\n");
      poVar1 = std::operator<<(poVar1,"  ");
      poVar1 = std::operator<<(poVar1,(string *)expr);
      poVar1 = std::operator<<(poVar1,"\n");
      std::operator<<(poVar1,"Dependency loop found.");
      pcVar2 = cmLocalGenerator::GetCMakeInstance(context->LG);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8,&context->Backtrace);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      iVar5 = 1;
      while (pcVar4 != (cmGeneratorExpressionDAGChecker *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar1 = std::operator<<((ostream *)&e,"Loop step ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
        poVar1 = std::operator<<(poVar1,"\n");
        poVar1 = std::operator<<(poVar1,"  ");
        if (pcVar4->Content == (GeneratorExpressionContent *)0x0) {
          std::__cxx11::string::string((string *)&local_1c8,(string *)expr);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1c8,pcVar4->Content);
        }
        poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
        std::operator<<(poVar1,"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        pcVar2 = cmLocalGenerator::GetCMakeInstance(context->LG);
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8,&pcVar4->Backtrace);
        std::__cxx11::string::~string((string *)&local_1c8);
        pcVar4 = pcVar4->Parent;
        iVar5 = iVar5 + 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar1 = std::operator<<((ostream *)&e,"Error evaluating generator expression:\n");
      poVar1 = std::operator<<(poVar1,"  ");
      poVar1 = std::operator<<(poVar1,(string *)expr);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"Self reference on target \"");
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(context->HeadTarget);
      poVar1 = std::operator<<(poVar1,(string *)psVar3);
      std::operator<<(poVar1,"\".\n");
      pcVar2 = cmLocalGenerator::GetCMakeInstance(context->LG);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8,&pcVar4->Backtrace);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  return;
}

Assistant:

void cmGeneratorExpressionDAGChecker::ReportError(
  cmGeneratorExpressionContext* context, const std::string& expr)
{
  if (this->CheckResult == DAG) {
    return;
  }

  context->HadError = true;
  if (context->Quiet) {
    return;
  }

  const cmGeneratorExpressionDAGChecker* parent = this->Parent;

  if (parent && !parent->Parent) {
    std::ostringstream e;
    e << "Error evaluating generator expression:\n"
      << "  " << expr << "\n"
      << "Self reference on target \"" << context->HeadTarget->GetName()
      << "\".\n";
    context->LG->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str(), parent->Backtrace);
    return;
  }

  {
    std::ostringstream e;
    /* clang-format off */
  e << "Error evaluating generator expression:\n"
    << "  " << expr << "\n"
    << "Dependency loop found.";
    /* clang-format on */
    context->LG->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str(), context->Backtrace);
  }

  int loopStep = 1;
  while (parent) {
    std::ostringstream e;
    e << "Loop step " << loopStep << "\n"
      << "  "
      << (parent->Content ? parent->Content->GetOriginalExpression() : expr)
      << "\n";
    context->LG->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str(), parent->Backtrace);
    parent = parent->Parent;
    ++loopStep;
  }
}